

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_fixed_suite::fixed_expand_back_n(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  uint uVar2;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  int array [4];
  circular_view<int,_4UL> span;
  allocator_type local_71;
  vector<int,_std::allocator<int>_> local_70;
  circular_view<int,_4UL> *local_58;
  ulong uStack_50;
  int local_48 [4];
  type local_38 [4];
  circular_view<int,_4UL> local_28;
  
  local_28.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_28.member.size = 0;
  local_28.member.next = 4;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  input._M_len = 3;
  input._M_array = (iterator)&local_70;
  vista::circular_view<int,_4UL>::assign(&local_28,input);
  local_28.member.next = (ulong)((uint)local_28.member.next & 3) ^ 6;
  uVar1 = local_28.member.size - 3;
  local_28.member.size = local_28.member.size + 2;
  if (uVar1 < 2) {
    local_28.member.size = 4;
  }
  local_48[0] = 0x16;
  local_48[1] = 0x21;
  local_48[2] = 0;
  local_48[3] = 0xb;
  __l._M_len = 4;
  __l._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,&local_71);
  first_begin.current._0_4_ = (uint)local_28.member.next - (int)local_28.member.size & 7;
  uVar2 = (uint)local_28.member.next & 7;
  uStack_50 = (ulong)uVar2;
  second_end._M_current._4_4_ =
       local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end._M_current._0_4_ =
       local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end.current._0_4_ = uVar2;
  first_end.parent = &local_28;
  first_end.current._4_4_ = 0;
  first_begin.parent = &local_28;
  first_begin.current._4_4_ = 0;
  local_58 = &local_28;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x453,"void api_fixed_suite::fixed_expand_back_n()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,second_end);
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fixed_expand_back_n()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    span = { 11, 22, 33 };
    span.expand_back(2);
    {
        std::vector<int> expect = { 22, 33, 0, 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}